

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

RepeatedFieldAccessor * __thiscall
google::protobuf::Reflection::RepeatedFieldAccessor(Reflection *this,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  CppStringType CVar3;
  LogMessage *pLVar4;
  LogMessage local_78;
  Voidify local_61;
  LogMessage local_60;
  Voidify local_4d [20];
  byte local_39;
  LogMessage local_38;
  Voidify local_21;
  FieldDescriptor *local_20;
  FieldDescriptor *field_local;
  Reflection *this_local;
  
  local_20 = field;
  field_local = (FieldDescriptor *)this;
  bVar1 = FieldDescriptor::is_repeated(field);
  local_39 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
               ,0x1d1,"field->is_repeated()");
    local_39 = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar4);
  }
  if ((local_39 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  CVar2 = FieldDescriptor::cpp_type(local_20);
  switch(CVar2) {
  case CPPTYPE_INT32:
    this_local = (Reflection *)
                 (anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<int>>();
    break;
  case CPPTYPE_INT64:
    this_local = (Reflection *)
                 (anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>();
    break;
  case CPPTYPE_UINT32:
    this_local = (Reflection *)
                 (anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>
                           ();
    break;
  case CPPTYPE_UINT64:
    this_local = (Reflection *)
                 (anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>
                           ();
    break;
  case CPPTYPE_DOUBLE:
    this_local = (Reflection *)
                 (anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>();
    break;
  case CPPTYPE_FLOAT:
    this_local = (Reflection *)
                 (anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>();
    break;
  case CPPTYPE_BOOL:
    this_local = (Reflection *)
                 (anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>();
    break;
  case CPPTYPE_ENUM:
    this_local = (Reflection *)
                 (anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<int>>();
    break;
  case CPPTYPE_STRING:
    CVar3 = FieldDescriptor::cpp_string_type(local_20);
    if (CVar3 != kView) {
      if (CVar3 == kCord) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_60,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
                   ,0x1e2);
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar4,(char (*) [34])"Repeated cords are not supported.");
        absl::lts_20250127::log_internal::Voidify::operator&&(local_4d,pLVar4);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_60);
      }
      if (CVar3 != kString) goto switchD_00401773_default;
    }
    this_local = (Reflection *)
                 anon_unknown_19::
                 GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>();
    break;
  case CPPTYPE_MESSAGE:
    bVar1 = FieldDescriptor::is_map(local_20);
    if (bVar1) {
      this_local = (Reflection *)
                   anon_unknown_19::GetSingleton<google::protobuf::internal::MapFieldAccessor>();
    }
    else {
      this_local = (Reflection *)
                   anon_unknown_19::
                   GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>();
    }
    break;
  default:
switchD_00401773_default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
               ,0x1ef);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [23])"Should not reach here.");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_78);
  }
  return (RepeatedFieldAccessor *)this_local;
}

Assistant:

const internal::RepeatedFieldAccessor* Reflection::RepeatedFieldAccessor(
    const FieldDescriptor* field) const {
  ABSL_CHECK(field->is_repeated());
  switch (field->cpp_type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, type) \
  case FieldDescriptor::CPPTYPE_##TYPE:   \
    return GetSingleton<internal::RepeatedFieldPrimitiveAccessor<type> >();
    HANDLE_PRIMITIVE_TYPE(INT32, int32_t)
    HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t)
    HANDLE_PRIMITIVE_TYPE(INT64, int64_t)
    HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t)
    HANDLE_PRIMITIVE_TYPE(FLOAT, float)
    HANDLE_PRIMITIVE_TYPE(DOUBLE, double)
    HANDLE_PRIMITIVE_TYPE(BOOL, bool)
    HANDLE_PRIMITIVE_TYPE(ENUM, int32_t)
#undef HANDLE_PRIMITIVE_TYPE
    case FieldDescriptor::CPPTYPE_STRING:
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kCord:
          ABSL_LOG(FATAL) << "Repeated cords are not supported.";
        case FieldDescriptor::CppStringType::kView:
        case FieldDescriptor::CppStringType::kString:
          return GetSingleton<internal::RepeatedPtrFieldStringAccessor>();
      }
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (field->is_map()) {
        return GetSingleton<internal::MapFieldAccessor>();
      } else {
        return GetSingleton<internal::RepeatedPtrFieldMessageAccessor>();
      }
  }
  ABSL_LOG(FATAL) << "Should not reach here.";
  return nullptr;
}